

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O3

string * __thiscall
google::protobuf::TextFormat::FieldValuePrinter::PrintInt32_abi_cxx11_
          (string *__return_storage_ptr__,FieldValuePrinter *this,int32 val)

{
  size_type *psVar1;
  BaseTextGenerator local_48;
  StringBaseTextGenerator generator;
  
  psVar1 = &generator.output_._M_string_length;
  local_48._vptr_BaseTextGenerator = (_func_int **)&PTR__StringBaseTextGenerator_003bc3f8;
  generator.output_._M_dataplus._M_p = (pointer)0x0;
  generator.output_._M_string_length._0_1_ = 0;
  generator.super_BaseTextGenerator._vptr_BaseTextGenerator = (_func_int **)psVar1;
  FastFieldValuePrinter::PrintInt32((FastFieldValuePrinter *)__return_storage_ptr__,val,&local_48);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,
             generator.super_BaseTextGenerator._vptr_BaseTextGenerator,
             generator.output_._M_dataplus._M_p +
             (long)generator.super_BaseTextGenerator._vptr_BaseTextGenerator);
  local_48._vptr_BaseTextGenerator = (_func_int **)&PTR__StringBaseTextGenerator_003bc3f8;
  if (generator.super_BaseTextGenerator._vptr_BaseTextGenerator != (_func_int **)psVar1) {
    operator_delete(generator.super_BaseTextGenerator._vptr_BaseTextGenerator);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string TextFormat::FieldValuePrinter::PrintInt32(int32 val) const {
  FORWARD_IMPL(PrintInt32, val);
}